

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  U32 h_00;
  char *pcVar1;
  BYTE *srcBase;
  reg_t sequence;
  BYTE *base;
  BYTE *dictEnd;
  BYTE *p;
  LZ4_stream_t_internal *dict;
  int dictSize_local;
  char *dictionary_local;
  LZ4_stream_t *LZ4_dict_local;
  U32 h;
  
  pcVar1 = dictionary + dictSize;
  if (((LZ4_dict->internal_donotuse).initCheck != 0) ||
     (0x40000000 < (LZ4_dict->internal_donotuse).currentOffset)) {
    LZ4_resetStream(LZ4_dict);
  }
  if (dictSize < 8) {
    LZ4_dict->table[0x801] = 0;
    (LZ4_dict->internal_donotuse).dictSize = 0;
    LZ4_dict_local._0_4_ = 0;
  }
  else {
    dictEnd = (BYTE *)dictionary;
    if (0x10000 < (long)pcVar1 - (long)dictionary) {
      dictEnd = (BYTE *)(pcVar1 + -0x10000);
    }
    (LZ4_dict->internal_donotuse).currentOffset =
         (LZ4_dict->internal_donotuse).currentOffset + 0x10000;
    srcBase = dictEnd + -(ulong)(LZ4_dict->internal_donotuse).currentOffset;
    (LZ4_dict->internal_donotuse).dictionary = dictEnd;
    (LZ4_dict->internal_donotuse).dictSize = (int)pcVar1 - (int)dictEnd;
    (LZ4_dict->internal_donotuse).currentOffset =
         (LZ4_dict->internal_donotuse).dictSize + (LZ4_dict->internal_donotuse).currentOffset;
    for (; dictEnd <= pcVar1 + -8; dictEnd = dictEnd + 3) {
      sequence = LZ4_read_ARCH(dictEnd);
      h_00 = LZ4_hash5(sequence,byU32);
      LZ4_putPositionOnHash(dictEnd,h_00,LZ4_dict,byU32,srcBase);
    }
    LZ4_dict_local._0_4_ = (LZ4_dict->internal_donotuse).dictSize;
  }
  return (uint32_t)LZ4_dict_local;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = &LZ4_dict->internal_donotuse;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    if ((dict->initCheck) || (dict->currentOffset > 1 GB))  /* Uninitialized structure, or reuse overflow */
        LZ4_resetStream(LZ4_dict);

    if (dictSize < (int)HASH_UNIT) {
        dict->dictionary = NULL;
        dict->dictSize = 0;
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    dict->currentOffset += 64 KB;
    base = p - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->currentOffset += dict->dictSize;

    while (p <= dictEnd-HASH_UNIT) {
        LZ4_putPosition(p, dict->hashTable, byU32, base);
        p+=3;
    }

    return dict->dictSize;
}